

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O2

int Abc_NtkLatchSweep(Abc_Ntk_t *pNtk)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  Abc_Obj_t *pLatch;
  Abc_Obj_t *pAVar4;
  int iVar5;
  Abc_Obj_t *pLatch_00;
  int i;
  
  iVar5 = 0;
  i = 0;
  pLatch_00 = (Abc_Obj_t *)0x0;
  do {
    if (pNtk->vBoxes->nSize <= i) {
      return iVar5;
    }
    pLatch = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vBoxes,i);
    pAVar4 = pLatch_00;
    if (((*(uint *)&pLatch->field_0x14 & 0xf) == 8) &&
       (iVar2 = Abc_NtkCheckConstant_rec
                          ((Abc_Obj_t *)pLatch->pNtk->vObjs->pArray[*(pLatch->vFanins).pArray]),
       iVar2 != -1)) {
      if (iVar2 == 0) {
        if ((*(uint *)&pLatch->field_0x14 & 0xf) != 8) {
          __assert_fail("Abc_ObjIsLatch(pLatch)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,0x1a9,"int Abc_LatchIsInit1(Abc_Obj_t *)");
        }
        if ((pLatch->field_5).pData == (void *)0x2) goto LAB_002c5e63;
LAB_002c5dd2:
        plVar1 = (long *)pLatch->pNtk->vObjs->pArray[*(pLatch->vFanins).pArray];
        pAVar4 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8);
      }
      else {
        if ((*(uint *)&pLatch->field_0x14 & 0xf) != 8) {
          __assert_fail("Abc_ObjIsLatch(pLatch)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,0x1a8,"int Abc_LatchIsInit0(Abc_Obj_t *)");
        }
        if ((pLatch->field_5).pData != (void *)0x1) goto LAB_002c5dd2;
LAB_002c5e63:
        pAVar4 = pLatch;
        if (pLatch_00 == (Abc_Obj_t *)0x0) goto LAB_002c5e3e;
        iVar2 = Abc_LatchInit(pLatch);
        iVar3 = Abc_LatchInit(pLatch_00);
        pAVar4 = (Abc_Obj_t *)pLatch_00->pNtk->vObjs->pArray[*(pLatch_00->vFanouts).pArray];
        if (iVar2 != iVar3) {
          pAVar4 = Abc_NtkCreateNodeInv(pNtk,pAVar4);
        }
      }
      Abc_ObjTransferFanout
                ((Abc_Obj_t *)pLatch->pNtk->vObjs->pArray[*(pLatch->vFanouts).pArray],pAVar4);
      Abc_NtkDeleteObj_rec((Abc_Obj_t *)pLatch->pNtk->vObjs->pArray[*(pLatch->vFanouts).pArray],0);
      iVar5 = iVar5 + 1;
      pAVar4 = pLatch_00;
    }
LAB_002c5e3e:
    i = i + 1;
    pLatch_00 = pAVar4;
  } while( true );
}

Assistant:

int Abc_NtkLatchSweep( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pFanin, * pLatch, * pLatchPivot = NULL;
    int Counter, RetValue, i;
    Counter = 0;
    // go through the latches
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        // check if the latch has constant input
        RetValue = Abc_NtkCheckConstant_rec( Abc_ObjFanin0(pLatch) );
        if ( RetValue == -1 )
            continue;
        // found a latch with constant fanin
        if ( (RetValue == 1 && Abc_LatchIsInit0(pLatch)) ||
             (RetValue == 0 && Abc_LatchIsInit1(pLatch)) )
        {
            // fanin constant differs from the latch init value
            if ( pLatchPivot == NULL )
            {
                pLatchPivot = pLatch;
                continue;
            }
            if ( Abc_LatchInit(pLatch) != Abc_LatchInit(pLatchPivot) ) // add inverter
                pFanin = Abc_NtkCreateNodeInv( pNtk, Abc_ObjFanout0(pLatchPivot) );
            else
                pFanin = Abc_ObjFanout0(pLatchPivot);
        }
        else
            pFanin = Abc_ObjFanin0(Abc_ObjFanin0(pLatch));
        // replace latch
        Abc_ObjTransferFanout( Abc_ObjFanout0(pLatch), pFanin );
        // delete the extra nodes
        Abc_NtkDeleteObj_rec( Abc_ObjFanout0(pLatch), 0 );
        Counter++;
    }
    return Counter;
}